

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContextLimits::ReferenceContextLimits
          (ReferenceContextLimits *this,RenderContext *renderCtx)

{
  bool bVar1;
  deUint32 dVar2;
  int iVar3;
  undefined4 extraout_var;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar4;
  
  dVar2 = (*renderCtx->_vptr_RenderContext[2])(renderCtx);
  (this->contextType).super_ApiType.m_bits = dVar2;
  this->maxTextureImageUnits = 0;
  this->maxTexture2DSize = 0;
  this->maxTextureCubeSize = 0;
  this->maxTexture2DArrayLayers = 0;
  *(undefined1 (*) [16])&this->maxTexture3DSize = (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   ((long)&(this->extensionList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = (undefined1  [16])0x0;
  *(undefined4 *)
   ((long)&(this->extensionList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->extensionStr)._M_dataplus._M_p = (pointer)&(this->extensionStr).field_2;
  (this->extensionStr)._M_string_length = 0;
  (this->extensionStr).field_2._M_local_buf[0] = '\0';
  iVar3 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  lVar4 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar4 + 0x868))(0x8872,&this->maxTextureImageUnits);
  (**(code **)(lVar4 + 0x868))(0xd33,&this->maxTexture2DSize);
  (**(code **)(lVar4 + 0x868))(0x851c,&this->maxTextureCubeSize);
  (**(code **)(lVar4 + 0x868))(0x84e8,&this->maxRenderbufferSize);
  (**(code **)(lVar4 + 0x868))(0x8869,&this->maxVertexAttribs);
  bVar1 = glu::contextSupports((ContextType)(this->contextType).super_ApiType.m_bits,(ApiType)0x3);
  if ((bVar1) || (((this->contextType).super_ApiType.m_bits & 0x300) == 0x100)) {
    (**(code **)(lVar4 + 0x868))(0x88ff,&this->maxTexture2DArrayLayers);
    (**(code **)(lVar4 + 0x868))(0x8073);
  }
  uVar7._0_4_ = this->maxTexture2DSize;
  uVar7._4_4_ = this->maxTextureCubeSize;
  uVar6 = CONCAT44(-(uint)((int)uVar7._4_4_ < DAT_0087db60._4_4_),
                   -(uint)((int)(undefined4)uVar7 < (int)DAT_0087db60));
  uVar7 = ~uVar6 & (ulong)DAT_0087db60 | uVar7 & uVar6;
  this->maxTexture2DSize = (int)uVar7;
  this->maxTextureCubeSize = (int)(uVar7 >> 0x20);
  iVar3 = this->maxTexture3DSize;
  iVar5 = 0x4000;
  if (iVar3 < 0x4000) {
    iVar5 = iVar3;
  }
  this->maxTexture3DSize = iVar5;
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                  ,0x10b);
  addExtension(this,"GL_EXT_color_buffer_half_float");
  addExtension(this,"GL_EXT_color_buffer_float");
  bVar1 = glu::contextSupports((ContextType)(this->contextType).super_ApiType.m_bits,(ApiType)0x13);
  if (bVar1) {
    addExtension(this,"GL_EXT_texture_cube_map_array");
  }
  return;
}

Assistant:

ReferenceContextLimits::ReferenceContextLimits (const glu::RenderContext& renderCtx)
	: contextType				(renderCtx.getType())
	, maxTextureImageUnits		(0)
	, maxTexture2DSize			(0)
	, maxTextureCubeSize		(0)
	, maxTexture2DArrayLayers	(0)
	, maxTexture3DSize			(0)
	, maxRenderbufferSize		(0)
	, maxVertexAttribs			(0)
{
	const glw::Functions& gl = renderCtx.getFunctions();

	gl.getIntegerv(GL_MAX_TEXTURE_IMAGE_UNITS,		&maxTextureImageUnits);
	gl.getIntegerv(GL_MAX_TEXTURE_SIZE,				&maxTexture2DSize);
	gl.getIntegerv(GL_MAX_CUBE_MAP_TEXTURE_SIZE,	&maxTextureCubeSize);
	gl.getIntegerv(GL_MAX_RENDERBUFFER_SIZE,		&maxRenderbufferSize);
	gl.getIntegerv(GL_MAX_VERTEX_ATTRIBS,			&maxVertexAttribs);

	if (contextSupports(contextType, glu::ApiType::es(3,0)) || glu::isContextTypeGLCore(contextType))
	{
		gl.getIntegerv(GL_MAX_ARRAY_TEXTURE_LAYERS,	&maxTexture2DArrayLayers);
		gl.getIntegerv(GL_MAX_3D_TEXTURE_SIZE,		&maxTexture3DSize);
	}

	// Limit texture sizes to supported values
	maxTexture2DSize	= de::min(maxTexture2DSize,		(int)MAX_TEXTURE_SIZE);
	maxTextureCubeSize	= de::min(maxTextureCubeSize,	(int)MAX_TEXTURE_SIZE);
	maxTexture3DSize	= de::min(maxTexture3DSize,		(int)MAX_TEXTURE_SIZE);

	GLU_EXPECT_NO_ERROR(gl.getError(), GL_NO_ERROR);

	// \todo [pyry] Figure out following things:
	// + supported fbo configurations
	// ...

	// \todo [2013-08-01 pyry] Do we want to make these conditional based on renderCtx?
	addExtension("GL_EXT_color_buffer_half_float");
	addExtension("GL_EXT_color_buffer_float");

	if (contextSupports(contextType, glu::ApiType::es(3,1)))
		addExtension("GL_EXT_texture_cube_map_array");
}